

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

char * stbi__hdr_gettoken(stbi__context *z,char *buffer)

{
  stbi_uc sVar1;
  int iVar2;
  bool bVar3;
  stbi_uc local_1d;
  int local_1c;
  char c;
  int len;
  char *buffer_local;
  stbi__context *z_local;
  
  local_1c = 0;
  local_1d = stbi__get8(z);
  while (iVar2 = stbi__at_eof(z), iVar2 == 0 && local_1d != '\n') {
    iVar2 = local_1c + 1;
    buffer[local_1c] = local_1d;
    local_1c = iVar2;
    if (iVar2 == 0x3ff) goto LAB_00149c85;
    local_1d = stbi__get8(z);
  }
LAB_00149ccd:
  buffer[local_1c] = '\0';
  return buffer;
LAB_00149c85:
  do {
    iVar2 = stbi__at_eof(z);
    bVar3 = false;
    if (iVar2 == 0) {
      sVar1 = stbi__get8(z);
      bVar3 = sVar1 != '\n';
    }
  } while (bVar3);
  goto LAB_00149ccd;
}

Assistant:

static char *stbi__hdr_gettoken(stbi__context *z, char *buffer)
{
   int len=0;
   char c = '\0';

   c = (char) stbi__get8(z);

   while (!stbi__at_eof(z) && c != '\n') {
      buffer[len++] = c;
      if (len == STBI__HDR_BUFLEN-1) {
         // flush to end of line
         while (!stbi__at_eof(z) && stbi__get8(z) != '\n')
            ;
         break;
      }
      c = (char) stbi__get8(z);
   }

   buffer[len] = 0;
   return buffer;
}